

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

void __thiscall
ON_BumpFunction::Internal_EvaluateLinearBump
          (ON_BumpFunction *this,double t,double dt,int der_count,double *value)

{
  long lVar1;
  
  *value = t;
  if ((0 < der_count) && (value[1] = dt, der_count != 1)) {
    for (lVar1 = 0; der_count + -1 != (int)lVar1; lVar1 = lVar1 + 1) {
      value[lVar1 + 2] = 0.0;
    }
  }
  return;
}

Assistant:

void ON_BumpFunction::Internal_EvaluateLinearBump(double t, double dt, int der_count, double* value) const
{
  value[0] = t;
  if (der_count>0)
  {
    value[1] = dt;
    if ( der_count > 1 )
    {
      der_count--;
      value += 2;
      while(der_count--)
        *value++ = 0.0;
    }
  }
}